

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis<double,unsigned_long,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,MissingAction missing_action)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  ulong *st_00;
  double *Xc_00;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar6;
  unsigned_long *puVar7;
  unsigned_long *__value;
  double dVar8;
  undefined1 auVar9 [16];
  long in_stack_00000008;
  int in_stack_00000010;
  double out;
  double v;
  double sn;
  double cnt_l;
  size_t *row_1;
  size_t *row;
  double xval;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  size_t cnt;
  double x_sq;
  double s4;
  double s3;
  double s2;
  double s1;
  unsigned_long *in_stack_ffffffffffffff20;
  unsigned_long *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff35;
  byte in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar10;
  unsigned_long *Xc_ind_00;
  ulong *in_stack_ffffffffffffff58;
  ulong *in_stack_ffffffffffffff60;
  size_t *in_stack_ffffffffffffff68;
  MissingAction missing_action_00;
  ulong local_68;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_8;
  
  if (*(long *)(in_stack_00000008 + in_RCX * 8) == *(long *)(in_stack_00000008 + 8 + in_RCX * 8)) {
    local_8 = -INFINITY;
  }
  else {
    local_40 = 0.0;
    local_48 = 0.0;
    local_50 = 0.0;
    local_58 = 0.0;
    local_68 = (in_RDX - in_RSI) + 1;
    if (local_68 < 2) {
      local_8 = -INFINITY;
    }
    else {
      Xc_00 = *(double **)(in_stack_00000008 + in_RCX * 8);
      pdVar5 = (double *)(*(long *)(in_stack_00000008 + 8 + in_RCX * 8) + -1);
      uVar1 = *(ulong *)(in_R9 + (long)pdVar5 * 8);
      st_00 = std::lower_bound<unsigned_long*,unsigned_long>
                        ((unsigned_long *)
                         CONCAT17(in_stack_ffffffffffffff37,
                                  CONCAT16(in_stack_ffffffffffffff36,
                                           CONCAT15(in_stack_ffffffffffffff35,
                                                    CONCAT14(in_stack_ffffffffffffff34,
                                                             in_stack_ffffffffffffff30)))),
                         in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      if (in_stack_00000010 == 0) {
        while( true ) {
          uVar10 = false;
          if ((st_00 != (ulong *)(in_RDI + in_RDX * 8 + 8)) &&
             (uVar10 = false, Xc_00 != (double *)((long)pdVar5 + 1))) {
            uVar10 = *st_00 <= uVar1;
          }
          if ((bool)uVar10 == false) break;
          if (*(ulong *)(in_R9 + (long)Xc_00 * 8) == *st_00) {
            in_stack_ffffffffffffff68 = *(size_t **)(in_R8 + (long)Xc_00 * 8);
            dVar6 = (double)in_stack_ffffffffffffff68 * (double)in_stack_ffffffffffffff68;
            local_40 = (double)in_stack_ffffffffffffff68 + local_40;
            local_48 = fma((double)in_stack_ffffffffffffff68,(double)in_stack_ffffffffffffff68,
                           local_48);
            local_50 = fma(dVar6,(double)in_stack_ffffffffffffff68,local_50);
            local_58 = fma(dVar6,dVar6,local_58);
            if ((st_00 == (ulong *)(in_RDI + in_RDX * 8)) || (Xc_00 == pdVar5)) break;
            st_00 = st_00 + 1;
            puVar7 = std::lower_bound<unsigned_long*,unsigned_long>
                               ((unsigned_long *)
                                CONCAT17(in_stack_ffffffffffffff37,
                                         CONCAT16(in_stack_ffffffffffffff36,
                                                  CONCAT15(uVar10,CONCAT14(in_stack_ffffffffffffff34
                                                                           ,
                                                  in_stack_ffffffffffffff30)))),
                                in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
            Xc_00 = (double *)((long)puVar7 - in_R9 >> 3);
          }
          else if (*st_00 < *(ulong *)(in_R9 + (long)Xc_00 * 8)) {
            st_00 = std::lower_bound<unsigned_long*,unsigned_long>
                              ((unsigned_long *)
                               CONCAT17(in_stack_ffffffffffffff37,
                                        CONCAT16(in_stack_ffffffffffffff36,
                                                 CONCAT15(uVar10,CONCAT14(in_stack_ffffffffffffff34,
                                                                          in_stack_ffffffffffffff30)
                                                         ))),in_stack_ffffffffffffff28,
                               in_stack_ffffffffffffff20);
          }
          else {
            puVar7 = std::lower_bound<unsigned_long*,unsigned_long>
                               ((unsigned_long *)
                                CONCAT17(in_stack_ffffffffffffff37,
                                         CONCAT16(in_stack_ffffffffffffff36,
                                                  CONCAT15(uVar10,CONCAT14(in_stack_ffffffffffffff34
                                                                           ,
                                                  in_stack_ffffffffffffff30)))),
                                in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
            Xc_00 = (double *)((long)puVar7 - in_R9 >> 3);
          }
        }
        missing_action_00 = (MissingAction)pdVar5;
        in_stack_ffffffffffffff58 = st_00;
        st_00 = in_stack_ffffffffffffff60;
      }
      else {
        while( true ) {
          uVar10 = false;
          if ((st_00 != (ulong *)(in_RDI + in_RDX * 8 + 8)) &&
             (uVar10 = false, Xc_00 != (double *)((long)pdVar5 + 1))) {
            uVar10 = *st_00 <= uVar1;
          }
          if ((bool)uVar10 == false) break;
          if (*(ulong *)(in_R9 + (long)Xc_00 * 8) == *st_00) {
            in_stack_ffffffffffffff68 = *(size_t **)(in_R8 + (long)Xc_00 * 8);
            uVar4 = std::isnan((double)in_stack_ffffffffffffff68);
            in_stack_ffffffffffffff36 = 1;
            if ((uVar4 & 1) == 0) {
              iVar3 = std::isinf((double)in_stack_ffffffffffffff68);
              in_stack_ffffffffffffff36 = (byte)iVar3;
            }
            if ((in_stack_ffffffffffffff36 & 1) == 0) {
              dVar6 = (double)in_stack_ffffffffffffff68 * (double)in_stack_ffffffffffffff68;
              local_40 = (double)in_stack_ffffffffffffff68 + local_40;
              local_48 = fma((double)in_stack_ffffffffffffff68,(double)in_stack_ffffffffffffff68,
                             local_48);
              local_50 = fma(dVar6,(double)in_stack_ffffffffffffff68,local_50);
              local_58 = fma(dVar6,dVar6,local_58);
            }
            else {
              local_68 = local_68 - 1;
            }
            if ((st_00 == (ulong *)(in_RDI + in_RDX * 8)) || (Xc_00 == pdVar5)) break;
            st_00 = st_00 + 1;
            puVar7 = std::lower_bound<unsigned_long*,unsigned_long>
                               ((unsigned_long *)
                                CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff36,
                                                         CONCAT15(in_stack_ffffffffffffff35,
                                                                  CONCAT14(in_stack_ffffffffffffff34
                                                                           ,
                                                  in_stack_ffffffffffffff30)))),
                                in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
            Xc_00 = (double *)((long)puVar7 - in_R9 >> 3);
          }
          else if (*st_00 < *(ulong *)(in_R9 + (long)Xc_00 * 8)) {
            st_00 = std::lower_bound<unsigned_long*,unsigned_long>
                              ((unsigned_long *)
                               CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff36,
                                                        CONCAT15(in_stack_ffffffffffffff35,
                                                                 CONCAT14(in_stack_ffffffffffffff34,
                                                                          in_stack_ffffffffffffff30)
                                                                ))),in_stack_ffffffffffffff28,
                               in_stack_ffffffffffffff20);
          }
          else {
            puVar7 = std::lower_bound<unsigned_long*,unsigned_long>
                               ((unsigned_long *)
                                CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff36,
                                                         CONCAT15(in_stack_ffffffffffffff35,
                                                                  CONCAT14(in_stack_ffffffffffffff34
                                                                           ,
                                                  in_stack_ffffffffffffff30)))),
                                in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
            Xc_00 = (double *)((long)puVar7 - in_R9 >> 3);
          }
        }
        missing_action_00 = (MissingAction)pdVar5;
        if (local_68 <=
            (ulong)(((in_RDX - in_RSI) + 1) -
                   (*(long *)(in_stack_00000008 + 8 + in_RCX * 8) -
                   *(long *)(in_stack_00000008 + in_RCX * 8)))) {
          return -INFINITY;
        }
      }
      bVar2 = true;
      if (1 < local_68) {
        bVar2 = true;
        if ((local_48 != 0.0) || (NAN(local_48))) {
          bVar2 = local_48 == local_40 * local_40;
        }
      }
      if (bVar2) {
        local_8 = -INFINITY;
      }
      else {
        auVar9._8_4_ = (int)(local_68 >> 0x20);
        auVar9._0_8_ = local_68;
        auVar9._12_4_ = 0x45300000;
        dVar6 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0);
        puVar7 = (unsigned_long *)(local_40 / dVar6);
        __value = (unsigned_long *)(-(double)puVar7 * (double)puVar7 + local_48 / dVar6);
        uVar4 = std::isnan((double)__value);
        if ((uVar4 & 1) == 0) {
          Xc_ind_00 = __value;
          dVar8 = std::numeric_limits<double>::epsilon();
          if ((dVar8 < (double)__value) ||
             (bVar2 = check_more_than_two_unique_values<double,unsigned_long>
                                (in_stack_ffffffffffffff68,(size_t)st_00,
                                 (size_t)in_stack_ffffffffffffff58,(size_t)dVar6,puVar7,Xc_ind_00,
                                 Xc_00,missing_action_00), bVar2)) {
            if ((double)Xc_ind_00 <= 0.0) {
              local_8 = 0.0;
            }
            else {
              local_8 = (dVar6 * (double)puVar7 * (double)puVar7 * (double)puVar7 * (double)puVar7 +
                        -(local_40 * 4.0) * (double)puVar7 * (double)puVar7 * (double)puVar7 +
                        local_48 * 6.0 * (double)puVar7 * (double)puVar7 +
                        -(local_50 * 4.0) * (double)puVar7 + local_58) /
                        (dVar6 * (double)Xc_ind_00 * (double)Xc_ind_00);
              uVar4 = std::isnan(local_8);
              if (((uVar4 & 1) == 0) && (uVar4 = std::isinf(local_8), (uVar4 & 1) == 0)) {
                if (local_8 <= 0.0) {
                  local_8 = 0.0;
                }
              }
              else {
                local_8 = -INFINITY;
              }
            }
          }
          else {
            local_8 = -INFINITY;
          }
        }
        else {
          local_8 = -INFINITY;
        }
      }
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = end - st + 1;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt--;
                }

                else
                {
                    /* TODO: is it safe to use FMA here? some calculations rely on assuming that
                       some of these 's' are larger than the others. Would this procedure be guaranteed
                       to preserve such differences if done with a mixture of sums and FMAs? */
                    x_sq = square(xval);
                    s1 += xval;
                    s2  = std::fma(xval, xval, s2);
                    s3  = std::fma(x_sq, xval, s3);
                    s4  = std::fma(x_sq, x_sq, s4);
                    // s1 += pw1(xval);
                    // s2 += pw2(xval);
                    // s3 += pw3(xval);
                    // s4 += pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= (end - st + 1) - (Xc_indptr[col_num+1] - Xc_indptr[col_num]))) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}